

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cpp
# Opt level: O2

void CreateBackwardReferencesNH4
               (size_t num_bytes,size_t position,uint8_t *ringbuffer,size_t ringbuffer_mask,
               ContextLut literal_context_lut,BrotliEncoderParams *params,Hasher *hasher,
               int *dist_cache,size_t *last_insert_len,Command *commands,size_t *num_commands,
               size_t *num_literals)

{
  ulong uVar1;
  ulong *puVar2;
  ulong uVar3;
  size_t sVar4;
  size_t sVar5;
  BrotliEncoderDictionary *pBVar6;
  uint32_t *puVar7;
  HasherCommon *pHVar8;
  BrotliDictionary *pBVar9;
  int iVar10;
  uint uVar11;
  ushort uVar12;
  uint16_t uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  byte bVar17;
  int iVar18;
  size_t sVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  uint8_t uVar29;
  uint uVar30;
  ulong *puVar31;
  ulong uVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  char cVar36;
  bool bVar37;
  ulong uVar38;
  uint32_t uVar39;
  uint uVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  long lVar44;
  int iVar45;
  ulong *puVar46;
  ulong local_180;
  ulong local_178;
  ulong local_170;
  int local_14c;
  ulong local_140;
  ulong local_128;
  Command *local_108;
  int local_100;
  uint local_fc;
  ulong local_e8;
  ulong local_d0;
  ulong local_a0;
  uint8_t *s1_orig;
  
  uVar14 = (1L << ((byte)params->lgwin & 0x3f)) - 0x10;
  uVar3 = (position - 7) + num_bytes;
  sVar19 = position;
  if (7 < num_bytes) {
    sVar19 = uVar3;
  }
  lVar20 = 0x200;
  if (params->quality < 9) {
    lVar20 = 0x40;
  }
  uVar1 = position + num_bytes;
  sVar4 = params->stream_offset;
  uVar43 = *last_insert_len;
  uVar28 = lVar20 + position;
  sVar5 = (params->dictionary).compound.total_size;
  uVar11 = (uint)ringbuffer_mask;
  lVar15 = sVar5 + 1;
  local_108 = commands;
LAB_01f3dca4:
LAB_01f3dcb1:
  uVar42 = position;
  if (uVar1 <= uVar42 + 8) {
    *last_insert_len = (uVar43 + uVar1) - uVar42;
    *num_commands = *num_commands + ((long)local_108 - (long)commands >> 4);
    return;
  }
  uVar26 = uVar14;
  if (uVar42 < uVar14) {
    uVar26 = uVar42;
  }
  uVar21 = sVar4 + uVar42;
  if (uVar14 <= sVar4 + uVar42) {
    uVar21 = uVar14;
  }
  if ((params->dictionary).contextual.context_based == 0) {
    local_fc = 0;
    local_a0 = 0;
  }
  else {
    if (uVar42 == 0) {
      local_a0 = 0;
LAB_01f3dd20:
      uVar24 = 0;
    }
    else {
      local_a0 = (ulong)ringbuffer[uVar42 - 1 & ringbuffer_mask];
      if (uVar42 == 1) goto LAB_01f3dd20;
      uVar24 = (ulong)ringbuffer[uVar42 - 2 & ringbuffer_mask];
    }
    local_fc = (uint)(params->dictionary).contextual.context_map
                     [literal_context_lut[uVar24 + 0x100] | literal_context_lut[local_a0]];
  }
  local_128 = uVar1 - uVar42;
  uVar24 = uVar42 & ringbuffer_mask;
  puVar2 = (ulong *)(ringbuffer + uVar24);
  uVar29 = ringbuffer[uVar24];
  local_178 = (ulong)*dist_cache;
  local_170 = 0x7e4;
  if ((uVar42 - local_178 < uVar42) &&
     (uVar30 = (uint)(uVar42 - local_178) & uVar11, uVar29 == ringbuffer[uVar30])) {
    puVar31 = (ulong *)(ringbuffer + uVar30);
    lVar34 = 0;
    uVar16 = local_128;
    puVar46 = puVar2;
LAB_01f3ddaf:
    if (uVar16 < 8) {
      for (uVar41 = 0;
          (uVar16 != uVar41 &&
          (*(char *)((long)puVar31 + uVar41) == *(char *)((long)puVar46 + uVar41)));
          uVar41 = uVar41 + 1) {
      }
      uVar41 = uVar41 - lVar34;
    }
    else {
      if (*puVar46 == *puVar31) goto code_r0x01f3ddc0;
      uVar41 = *puVar31 ^ *puVar46;
      uVar16 = 0;
      if (uVar41 != 0) {
        for (; (uVar41 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
        }
      }
      uVar41 = (uVar16 >> 3 & 0x1fffffff) - lVar34;
    }
    if ((uVar41 < 4) || (uVar16 = uVar41 * 0x87 + 0x78f, uVar16 < 0x7e5)) goto LAB_01f3de34;
    uVar29 = *(uint8_t *)((long)puVar2 + uVar41);
    local_170 = uVar16;
  }
  else {
LAB_01f3de34:
    local_178 = 0;
    uVar41 = 0;
  }
  pBVar6 = (params->dictionary).contextual.dict[local_fc];
  uVar16 = (params->dist).max_distance;
  puVar7 = (hasher->privat)._H2.buckets_;
  lVar34 = *(long *)(ringbuffer + uVar24);
  for (lVar35 = 0; lVar35 != 0x20; lVar35 = lVar35 + 8) {
    *(ulong *)((long)&s1_orig + lVar35) =
         (ulong)((uint)((ulong)(lVar34 * 0x7bd3579bd3000000) >> 0x2f) + (int)lVar35 & 0x1ffff);
  }
  uVar30 = (uint)uVar42;
  lVar35 = *(long *)((long)&s1_orig + (ulong)(uVar30 & 0x18));
  for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
    uVar33 = puVar7[(long)(&s1_orig)[lVar25]];
    puVar46 = (ulong *)(ringbuffer + (uVar11 & uVar33));
    if (((uVar29 == *(uint8_t *)(uVar41 + (long)puVar46)) && (uVar42 != uVar33)) &&
       (uVar24 = uVar42 - uVar33, uVar24 <= uVar26)) {
      lVar44 = 0;
      puVar31 = puVar2;
      uVar38 = local_128;
LAB_01f3df17:
      if (uVar38 < 8) {
        for (uVar22 = 0;
            (uVar38 != uVar22 &&
            (*(char *)((long)puVar46 + uVar22) == *(char *)((long)puVar31 + uVar22)));
            uVar22 = uVar22 + 1) {
        }
      }
      else {
        if (*puVar31 == *puVar46) goto code_r0x01f3df29;
        uVar22 = *puVar46 ^ *puVar31;
        uVar38 = 0;
        if (uVar22 != 0) {
          for (; (uVar22 >> uVar38 & 1) == 0; uVar38 = uVar38 + 1) {
          }
        }
        uVar22 = uVar38 >> 3 & 0x1fffffff;
      }
      uVar22 = uVar22 - lVar44;
      if (3 < uVar22) {
        iVar18 = 0x1f;
        if ((uint)uVar24 != 0) {
          for (; (uint)uVar24 >> iVar18 == 0; iVar18 = iVar18 + -1) {
          }
        }
        uVar38 = (ulong)(iVar18 * -0x1e + 0x780) + uVar22 * 0x87;
        if (local_170 < uVar38) {
          uVar29 = *(uint8_t *)((long)puVar2 + uVar22);
          uVar41 = uVar22;
          local_178 = uVar24;
          local_170 = uVar38;
        }
      }
    }
  }
  local_14c = 0;
  if (local_170 == 0x7e4) {
    pHVar8 = (hasher->privat)._H2.common;
    uVar26 = pHVar8->dict_num_lookups;
    local_140 = pHVar8->dict_num_matches;
    if (uVar26 >> 7 <= local_140) {
      uVar24 = (ulong)((uint)((int)lVar34 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
      bVar37 = true;
      local_14c = 0;
      local_170 = 0x7e4;
      while (bVar37) {
        uVar26 = uVar26 + 1;
        pHVar8->dict_num_lookups = uVar26;
        bVar17 = pBVar6->hash_table_lengths[uVar24];
        uVar38 = (ulong)bVar17;
        if ((uVar38 != 0) && (uVar38 <= local_128)) {
          pBVar9 = pBVar6->words;
          puVar31 = (ulong *)(pBVar9->data +
                             (ulong)pBVar9->offsets_by_length[uVar38] +
                             pBVar6->hash_table_words[uVar24] * uVar38);
          lVar34 = 0;
          uVar22 = uVar38;
          puVar46 = puVar2;
LAB_01f3e0a6:
          if (uVar22 < 8) {
            for (uVar22 = 0;
                ((bVar17 & 7) != uVar22 &&
                (*(char *)((long)puVar46 + uVar22) == *(char *)((long)puVar31 + uVar22)));
                uVar22 = uVar22 + 1) {
            }
          }
          else {
            if (*puVar31 == *puVar46) goto code_r0x01f3e0b8;
            uVar32 = *puVar46 ^ *puVar31;
            uVar22 = 0;
            if (uVar32 != 0) {
              for (; (uVar32 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
              }
            }
            uVar22 = uVar22 >> 3 & 0x1fffffff;
          }
          uVar22 = uVar22 - lVar34;
          if (((uVar22 != 0) && (uVar38 < pBVar6->cutoffTransformsCount + uVar22)) &&
             (uVar38 = (ulong)pBVar6->hash_table_words[uVar24] + uVar21 + lVar15 +
                       ((ulong)((uint)(pBVar6->cutoffTransforms >>
                                      ((char)(uVar38 - uVar22) * '\x06' & 0x3fU)) & 0x3f) +
                        (uVar38 - uVar22) * 4 << (pBVar9->size_bits_by_length[uVar38] & 0x3f)),
             uVar38 <= uVar16)) {
            iVar18 = 0x1f;
            if ((uint)uVar38 != 0) {
              for (; (uint)uVar38 >> iVar18 == 0; iVar18 = iVar18 + -1) {
              }
            }
            uVar32 = (uVar22 * 0x87 - (ulong)(uint)(iVar18 * 0x1e)) + 0x780;
            if (local_170 <= uVar32) {
              local_14c = (uint)bVar17 - (int)uVar22;
              local_140 = local_140 + 1;
              pHVar8->dict_num_matches = local_140;
              local_178 = uVar38;
              local_170 = uVar32;
              uVar41 = uVar22;
            }
          }
        }
        uVar24 = uVar24 + 1;
        bVar37 = false;
      }
      goto LAB_01f3e1af;
    }
    puVar7[lVar35] = uVar30;
  }
  else {
LAB_01f3e1af:
    puVar7[lVar35] = uVar30;
    if (0x7e4 < local_170) goto LAB_01f3e289;
  }
  uVar43 = uVar43 + 1;
  position = uVar42 + 1;
  if (uVar28 < position) {
    if ((uint)((int)lVar20 * 4) + uVar28 < position) {
      uVar26 = uVar42 + 0x11;
      if (uVar3 <= uVar42 + 0x11) {
        uVar26 = uVar3;
      }
      for (; position < uVar26; position = position + 4) {
        puVar7[(uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                             0x7bd3579bd3000000) >> 0x2f) + ((uint)position & 0x18) & 0x1ffff] =
             (uint)position;
        uVar43 = uVar43 + 4;
      }
    }
    else {
      uVar26 = uVar42 + 9;
      if (uVar3 <= uVar42 + 9) {
        uVar26 = uVar3;
      }
      for (; position < uVar26; position = position + 2) {
        puVar7[(uint)((ulong)(*(long *)(ringbuffer + (position & ringbuffer_mask)) *
                             0x7bd3579bd3000000) >> 0x2f) + ((uint)position & 0x18) & 0x1ffff] =
             (uint)position;
        uVar43 = uVar43 + 2;
      }
    }
  }
  goto LAB_01f3dcb1;
code_r0x01f3ddc0:
  puVar46 = puVar46 + 1;
  puVar31 = puVar31 + 1;
  uVar16 = uVar16 - 8;
  lVar34 = lVar34 + -8;
  goto LAB_01f3ddaf;
code_r0x01f3df29:
  puVar31 = puVar31 + 1;
  puVar46 = puVar46 + 1;
  uVar38 = uVar38 - 8;
  lVar44 = lVar44 + -8;
  goto LAB_01f3df17;
code_r0x01f3e0b8:
  puVar31 = puVar31 + 1;
  puVar46 = puVar46 + 1;
  uVar22 = uVar22 - 8;
  lVar34 = lVar34 + -8;
  goto LAB_01f3e0a6;
LAB_01f3e289:
  iVar18 = *dist_cache;
  local_100 = 0;
  uVar28 = uVar43;
  do {
    local_128 = local_128 - 1;
    uVar26 = uVar41 - 1;
    if (local_128 <= uVar41 - 1) {
      uVar26 = local_128;
    }
    if (4 < params->quality) {
      uVar26 = 0;
    }
    uVar21 = uVar42 + 1;
    uVar24 = uVar14;
    if (uVar21 < uVar14) {
      uVar24 = uVar21;
    }
    local_e8 = sVar4 + uVar42 + 1;
    if (uVar14 <= local_e8) {
      local_e8 = uVar14;
    }
    if ((params->dictionary).contextual.context_based != 0) {
      local_fc = (uint)(params->dictionary).contextual.context_map
                       [literal_context_lut[local_a0 + 0x100] |
                        literal_context_lut[ringbuffer[uVar42 & ringbuffer_mask]]];
      local_a0 = (ulong)ringbuffer[uVar42 & ringbuffer_mask];
    }
    puVar2 = (ulong *)(ringbuffer + (uVar21 & ringbuffer_mask));
    cVar36 = *(char *)(uVar26 + (long)puVar2);
    uVar38 = uVar21 - (long)iVar18;
    if ((uVar38 < uVar21) &&
       (puVar46 = (ulong *)(ringbuffer + ((uint)uVar38 & uVar11)),
       cVar36 == *(char *)(uVar26 + (long)puVar46))) {
      uVar38 = 0x7e4;
      lVar34 = 0;
      uVar22 = local_128;
      puVar31 = puVar2;
LAB_01f3e397:
      if (uVar22 < 8) {
        for (uVar32 = 0;
            (uVar22 != uVar32 &&
            (*(char *)((long)puVar46 + uVar32) == *(char *)((long)puVar31 + uVar32)));
            uVar32 = uVar32 + 1) {
        }
      }
      else {
        if (*puVar31 == *puVar46) goto code_r0x01f3e3b0;
        uVar32 = *puVar46 ^ *puVar31;
        uVar22 = 0;
        if (uVar32 != 0) {
          for (; (uVar32 >> uVar22 & 1) == 0; uVar22 = uVar22 + 1) {
          }
        }
        uVar32 = uVar22 >> 3 & 0x1fffffff;
      }
      uVar32 = uVar32 - lVar34;
      if ((uVar32 < 4) || (uVar22 = uVar32 * 0x87 + 0x78f, uVar22 < 0x7e5)) {
        local_180 = 0;
      }
      else {
        cVar36 = *(char *)((long)puVar2 + uVar32);
        uVar26 = uVar32;
        uVar38 = uVar22;
        local_180 = (long)iVar18;
      }
    }
    else {
      uVar38 = 0x7e4;
      local_180 = 0;
    }
    pBVar6 = (params->dictionary).contextual.dict[local_fc];
    lVar34 = *(long *)(ringbuffer + (uVar21 & ringbuffer_mask));
    for (lVar35 = 0; lVar35 != 0x20; lVar35 = lVar35 + 8) {
      *(ulong *)((long)&s1_orig + lVar35) =
           (ulong)((uint)((ulong)(lVar34 * 0x7bd3579bd3000000) >> 0x2f) + (int)lVar35 & 0x1ffff);
    }
    lVar35 = *(long *)((long)&s1_orig + (ulong)((uint)uVar21 & 0x18));
    for (lVar25 = 0; lVar25 != 4; lVar25 = lVar25 + 1) {
      uVar30 = puVar7[(long)(&s1_orig)[lVar25]];
      puVar46 = (ulong *)(ringbuffer + (uVar11 & uVar30));
      if (((cVar36 == *(char *)(uVar26 + (long)puVar46)) && (uVar21 != uVar30)) &&
         (uVar22 = uVar21 - uVar30, uVar22 <= uVar24)) {
        lVar44 = 0;
        puVar31 = puVar2;
        uVar32 = local_128;
LAB_01f3e496:
        if (uVar32 < 8) {
          for (uVar23 = 0;
              (uVar32 != uVar23 &&
              (*(char *)((long)puVar46 + uVar23) == *(char *)((long)puVar31 + uVar23)));
              uVar23 = uVar23 + 1) {
          }
        }
        else {
          if (*puVar31 == *puVar46) goto code_r0x01f3e4a8;
          uVar23 = *puVar46 ^ *puVar31;
          uVar32 = 0;
          if (uVar23 != 0) {
            for (; (uVar23 >> uVar32 & 1) == 0; uVar32 = uVar32 + 1) {
            }
          }
          uVar23 = uVar32 >> 3 & 0x1fffffff;
        }
        uVar23 = uVar23 - lVar44;
        if (3 < uVar23) {
          iVar45 = 0x1f;
          if ((uint)uVar22 != 0) {
            for (; (uint)uVar22 >> iVar45 == 0; iVar45 = iVar45 + -1) {
            }
          }
          uVar32 = (ulong)(iVar45 * -0x1e + 0x780) + uVar23 * 0x87;
          if (uVar38 < uVar32) {
            cVar36 = *(char *)((long)puVar2 + uVar23);
            uVar26 = uVar23;
            uVar38 = uVar32;
            local_180 = uVar22;
          }
        }
      }
    }
    iVar45 = 0;
    if (uVar38 == 0x7e4) {
      pHVar8 = (hasher->privat)._H2.common;
      uVar24 = pHVar8->dict_num_lookups;
      local_d0 = pHVar8->dict_num_matches;
      uVar38 = 0x7e4;
      if (uVar24 >> 7 <= local_d0) {
        local_140._0_4_ = (int)lVar34;
        uVar22 = (ulong)((uint)((int)local_140 * 0x1e35a7bd) >> 0x11 & 0xfffffffe);
        bVar37 = true;
        iVar45 = 0;
        while (bVar37) {
          uVar24 = uVar24 + 1;
          pHVar8->dict_num_lookups = uVar24;
          bVar17 = pBVar6->hash_table_lengths[uVar22];
          uVar32 = (ulong)bVar17;
          if ((uVar32 != 0) && (uVar32 <= local_128)) {
            pBVar9 = pBVar6->words;
            puVar31 = (ulong *)(pBVar9->data +
                               (ulong)pBVar9->offsets_by_length[uVar32] +
                               pBVar6->hash_table_words[uVar22] * uVar32);
            lVar34 = 0;
            puVar46 = puVar2;
            uVar23 = uVar32;
LAB_01f3e6ab:
            if (uVar23 < 8) {
              for (uVar23 = 0;
                  ((bVar17 & 7) != uVar23 &&
                  (*(char *)((long)puVar46 + uVar23) == *(char *)((long)puVar31 + uVar23)));
                  uVar23 = uVar23 + 1) {
              }
            }
            else {
              if (*puVar31 == *puVar46) goto code_r0x01f3e6bc;
              uVar27 = *puVar46 ^ *puVar31;
              uVar23 = 0;
              if (uVar27 != 0) {
                for (; (uVar27 >> uVar23 & 1) == 0; uVar23 = uVar23 + 1) {
                }
              }
              uVar23 = uVar23 >> 3 & 0x1fffffff;
            }
            uVar23 = uVar23 - lVar34;
            if (((uVar23 != 0) && (uVar32 < pBVar6->cutoffTransformsCount + uVar23)) &&
               (uVar32 = (ulong)pBVar6->hash_table_words[uVar22] + lVar15 + local_e8 +
                         ((ulong)((uint)(pBVar6->cutoffTransforms >>
                                        ((char)(uVar32 - uVar23) * '\x06' & 0x3fU)) & 0x3f) +
                          (uVar32 - uVar23) * 4 << (pBVar9->size_bits_by_length[uVar32] & 0x3f)),
               uVar32 <= uVar16)) {
              iVar10 = 0x1f;
              if ((uint)uVar32 != 0) {
                for (; (uint)uVar32 >> iVar10 == 0; iVar10 = iVar10 + -1) {
                }
              }
              uVar27 = (uVar23 * 0x87 - (ulong)(uint)(iVar10 * 0x1e)) + 0x780;
              if (uVar38 <= uVar27) {
                iVar45 = (uint)bVar17 - (int)uVar23;
                local_d0 = local_d0 + 1;
                pHVar8->dict_num_matches = local_d0;
                uVar38 = uVar27;
                uVar26 = uVar23;
                local_180 = uVar32;
              }
            }
          }
          uVar22 = uVar22 + 1;
          bVar37 = false;
        }
      }
    }
    puVar7[lVar35] = (uint)uVar21;
    if (uVar38 < local_170 + 0xaf) {
      local_180 = local_178;
      uVar26 = uVar41;
      uVar21 = uVar42;
      uVar24 = uVar28;
      local_e8 = uVar42 + sVar4;
      iVar45 = local_14c;
      if (uVar14 <= uVar42 + sVar4) {
        local_e8 = uVar14;
      }
      break;
    }
    uVar24 = uVar43 + 4;
    if (local_100 == 3) break;
    uVar24 = uVar28 + 1;
    local_100 = local_100 + 1;
    uVar22 = uVar42 + 9;
    local_170 = uVar38;
    uVar42 = uVar21;
    uVar28 = uVar24;
    uVar41 = uVar26;
    local_178 = local_180;
    local_14c = iVar45;
  } while (uVar22 < uVar1);
  local_e8 = local_e8 + sVar5;
  if (local_e8 < local_180) {
LAB_01f3e8a8:
    uVar28 = local_180 + 0xf;
  }
  else {
    if (local_180 == (long)*dist_cache) {
      uVar28 = 0;
      goto LAB_01f3e8d8;
    }
    uVar28 = 1;
    if (local_180 != (long)dist_cache[1]) {
      uVar28 = (local_180 + 3) - (long)*dist_cache;
      if (uVar28 < 7) {
        bVar17 = (byte)((int)uVar28 << 2);
        uVar30 = 0x9750468;
      }
      else {
        uVar28 = (local_180 + 3) - (long)dist_cache[1];
        if (6 < uVar28) {
          uVar28 = 2;
          if ((local_180 != (long)dist_cache[2]) && (uVar28 = 3, local_180 != (long)dist_cache[3]))
          goto LAB_01f3e8a8;
          goto LAB_01f3e8ac;
        }
        bVar17 = (byte)((int)uVar28 << 2);
        uVar30 = 0xfdb1ace;
      }
      uVar28 = (ulong)(uVar30 >> (bVar17 & 0x1f) & 0xf);
    }
  }
LAB_01f3e8ac:
  if ((local_180 <= local_e8) && (uVar28 != 0)) {
    dist_cache[3] = dist_cache[2];
    *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
    *dist_cache = (int)local_180;
  }
LAB_01f3e8d8:
  local_108->insert_len_ = (uint32_t)uVar24;
  local_108->copy_len_ = iVar45 << 0x19 | (uint)uVar26;
  uVar42 = (ulong)(params->dist).num_direct_distance_codes;
  uVar43 = uVar42 + 0x10;
  uVar39 = 0;
  if (uVar43 <= uVar28) {
    uVar30 = (params->dist).distance_postfix_bits;
    bVar17 = (byte)uVar30;
    uVar42 = ((uVar28 - uVar42) + (4L << (bVar17 & 0x3f))) - 0x10;
    uVar33 = 0x1f;
    uVar40 = (uint)uVar42;
    if (uVar40 != 0) {
      for (; uVar40 >> uVar33 == 0; uVar33 = uVar33 - 1) {
      }
    }
    uVar33 = (uVar33 ^ 0xffffffe0) + 0x1f;
    uVar16 = (ulong)((uVar42 >> ((ulong)uVar33 & 0x3f) & 1) != 0);
    lVar34 = (ulong)uVar33 - (ulong)uVar30;
    uVar28 = (~(-1 << (bVar17 & 0x1f)) & uVar40) + uVar43 +
             (uVar16 + lVar34 * 2 + 0xfffe << (bVar17 & 0x3f)) | lVar34 * 0x400;
    uVar39 = (uint32_t)(uVar42 - (uVar16 + 2 << ((byte)uVar33 & 0x3f)) >> (bVar17 & 0x3f));
  }
  local_108->dist_prefix_ = (uint16_t)uVar28;
  local_108->dist_extra_ = uVar39;
  if (uVar24 < 6) {
    uVar43 = uVar24 & 0xffffffff;
  }
  else if (uVar24 < 0x82) {
    uVar30 = 0x1f;
    uVar33 = (uint)(uVar24 - 2);
    if (uVar33 != 0) {
      for (; uVar33 >> uVar30 == 0; uVar30 = uVar30 - 1) {
      }
    }
    uVar43 = (ulong)((int)(uVar24 - 2 >> ((char)(uVar30 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar30 ^ 0xffffffe0) * 2 + 0x40);
  }
  else if (uVar24 < 0x842) {
    uVar33 = (uint32_t)uVar24 - 0x42;
    uVar30 = 0x1f;
    if (uVar33 != 0) {
      for (; uVar33 >> uVar30 == 0; uVar30 = uVar30 - 1) {
      }
    }
    uVar43 = (ulong)((uVar30 ^ 0xffe0) + 0x2a);
  }
  else {
    uVar43 = 0x15;
    if (0x1841 < uVar24) {
      uVar43 = (ulong)(ushort)(0x17 - (uVar24 < 0x5842));
    }
  }
  uVar30 = iVar45 + (uint)uVar26;
  if (uVar30 < 10) {
    uVar33 = uVar30 - 2;
  }
  else if (uVar30 < 0x86) {
    uVar30 = uVar30 - 6;
    uVar33 = 0x1f;
    if (uVar30 != 0) {
      for (; uVar30 >> uVar33 == 0; uVar33 = uVar33 - 1) {
      }
    }
    uVar33 = (uVar30 >> ((char)(uVar33 ^ 0xffffffe0) + 0x1fU & 0x1f)) + (uVar33 ^ 0xffffffe0) * 2 +
             0x42;
  }
  else {
    uVar33 = 0x17;
    if (uVar30 < 0x846) {
      uVar33 = 0x1f;
      if (uVar30 - 0x46 != 0) {
        for (; uVar30 - 0x46 >> uVar33 == 0; uVar33 = uVar33 - 1) {
        }
      }
      uVar33 = (uVar33 ^ 0xffe0) + 0x2c;
    }
  }
  uVar12 = (ushort)uVar33;
  uVar13 = (uVar12 & 7) + ((ushort)uVar43 & 7) * 8;
  if ((((uVar28 & 0x3ff) == 0) && ((ushort)uVar43 < 8)) && (uVar12 < 0x10)) {
    if (7 < uVar12) {
      uVar13 = uVar13 + 0x40;
    }
  }
  else {
    iVar18 = (int)((uVar43 & 0xffff) >> 3) * 3 + ((uVar33 & 0xffff) >> 3);
    uVar13 = uVar13 + ((ushort)(0x520d40 >> ((char)iVar18 * '\x02' & 0x1fU)) & 0xc0) +
                      (short)iVar18 * 0x40 + 0x40;
  }
  local_108->cmd_prefix_ = uVar13;
  *num_literals = *num_literals + uVar24;
  position = uVar26 + uVar21;
  uVar43 = sVar19;
  if (position < sVar19) {
    uVar43 = position;
  }
  uVar42 = uVar21 + 2;
  if (local_180 < uVar26 >> 2) {
    uVar28 = position + local_180 * -4;
    if (uVar28 < uVar42) {
      uVar28 = uVar42;
    }
    uVar42 = uVar28;
    if (uVar43 < uVar28) {
      uVar42 = uVar43;
    }
  }
  uVar28 = uVar21 + lVar20 + uVar26 * 2;
  local_108 = local_108 + 1;
  for (; uVar42 < uVar43; uVar42 = uVar42 + 1) {
    puVar7[(uint)((ulong)(*(long *)(ringbuffer + (uVar42 & ringbuffer_mask)) * 0x7bd3579bd3000000)
                 >> 0x2f) + ((uint)uVar42 & 0x18) & 0x1ffff] = (uint)uVar42;
  }
  uVar43 = 0;
  goto LAB_01f3dca4;
code_r0x01f3e3b0:
  puVar31 = puVar31 + 1;
  puVar46 = puVar46 + 1;
  uVar22 = uVar22 - 8;
  lVar34 = lVar34 + -8;
  goto LAB_01f3e397;
code_r0x01f3e4a8:
  puVar31 = puVar31 + 1;
  puVar46 = puVar46 + 1;
  uVar32 = uVar32 - 8;
  lVar44 = lVar44 + -8;
  goto LAB_01f3e496;
code_r0x01f3e6bc:
  puVar31 = puVar31 + 1;
  puVar46 = puVar46 + 1;
  uVar23 = uVar23 - 8;
  lVar34 = lVar34 + -8;
  goto LAB_01f3e6ab;
}

Assistant:

static BROTLI_NOINLINE void EXPORT_FN(CreateBackwardReferences)(
    size_t num_bytes, size_t position,
    const uint8_t* ringbuffer, size_t ringbuffer_mask,
    ContextLut literal_context_lut, const BrotliEncoderParams* params,
    Hasher* hasher, int* dist_cache, size_t* last_insert_len,
    Command* commands, size_t* num_commands, size_t* num_literals) {
  HASHER()* privat = &hasher->privat.FN(_);
  /* Set maximum distance, see section 9.1. of the spec. */
  const size_t max_backward_limit = BROTLI_MAX_BACKWARD_LIMIT(params->lgwin);
  const size_t position_offset = params->stream_offset;

  const Command* const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  const size_t pos_end = position + num_bytes;
  const size_t store_end = num_bytes >= FN(StoreLookahead)() ?
      position + num_bytes - FN(StoreLookahead)() + 1 : position;

  /* For speed up heuristics for random data. */
  const size_t random_heuristics_window_size =
      LiteralSpreeLengthForSparseSearch(params);
  size_t apply_random_heuristics = position + random_heuristics_window_size;
  const size_t gap = params->dictionary.compound.total_size;

  /* Minimum score to accept a backward reference. */
  const score_t kMinScore = BROTLI_SCORE_BASE + 100;

  FN(PrepareDistanceCache)(privat, dist_cache);

  while (position + FN(HashTypeLength)() < pos_end) {
    size_t max_length = pos_end - position;
    size_t max_distance = BROTLI_MIN(size_t, position, max_backward_limit);
    size_t dictionary_start = BROTLI_MIN(size_t,
        position + position_offset, max_backward_limit);
    HasherSearchResult sr;
    int dict_id = 0;
    uint8_t p1 = 0;
    uint8_t p2 = 0;
    if (params->dictionary.contextual.context_based) {
      p1 = position >= 1 ?
          ringbuffer[(size_t)(position - 1) & ringbuffer_mask] : 0;
      p2 = position >= 2 ?
          ringbuffer[(size_t)(position - 2) & ringbuffer_mask] : 0;
      dict_id = params->dictionary.contextual.context_map[
          BROTLI_CONTEXT(p1, p2, literal_context_lut)];
    }
    sr.len = 0;
    sr.len_code_delta = 0;
    sr.distance = 0;
    sr.score = kMinScore;
    FN(FindLongestMatch)(privat, params->dictionary.contextual.dict[dict_id],
        ringbuffer, ringbuffer_mask, dist_cache, position, max_length,
        max_distance, dictionary_start + gap, params->dist.max_distance, &sr);
    if (ENABLE_COMPOUND_DICTIONARY) {
      LookupCompoundDictionaryMatch(&params->dictionary.compound, ringbuffer,
          ringbuffer_mask, dist_cache, position, max_length,
          dictionary_start, params->dist.max_distance, &sr);
    }
    if (sr.score > kMinScore) {
      /* Found a match. Let's look for something even better ahead. */
      int delayed_backward_references_in_row = 0;
      --max_length;
      for (;; --max_length) {
        const score_t cost_diff_lazy = 175;
        HasherSearchResult sr2;
        sr2.len = params->quality < MIN_QUALITY_FOR_EXTENSIVE_REFERENCE_SEARCH ?
            BROTLI_MIN(size_t, sr.len - 1, max_length) : 0;
        sr2.len_code_delta = 0;
        sr2.distance = 0;
        sr2.score = kMinScore;
        max_distance = BROTLI_MIN(size_t, position + 1, max_backward_limit);
        dictionary_start = BROTLI_MIN(size_t,
            position + 1 + position_offset, max_backward_limit);
        if (params->dictionary.contextual.context_based) {
          p2 = p1;
          p1 = ringbuffer[position & ringbuffer_mask];
          dict_id = params->dictionary.contextual.context_map[
              BROTLI_CONTEXT(p1, p2, literal_context_lut)];
        }
        FN(FindLongestMatch)(privat,
            params->dictionary.contextual.dict[dict_id],
            ringbuffer, ringbuffer_mask, dist_cache, position + 1, max_length,
            max_distance, dictionary_start + gap, params->dist.max_distance,
            &sr2);
        if (ENABLE_COMPOUND_DICTIONARY) {
          LookupCompoundDictionaryMatch(
              &params->dictionary.compound, ringbuffer,
              ringbuffer_mask, dist_cache, position + 1, max_length,
              dictionary_start, params->dist.max_distance, &sr2);
        }
        if (sr2.score >= sr.score + cost_diff_lazy) {
          /* Ok, let's just write one byte for now and start a match from the
             next byte. */
          ++position;
          ++insert_length;
          sr = sr2;
          if (++delayed_backward_references_in_row < 4 &&
              position + FN(HashTypeLength)() < pos_end) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          position + 2 * sr.len + random_heuristics_window_size;
      dictionary_start = BROTLI_MIN(size_t,
          position + position_offset, max_backward_limit);
      {
        /* The first 16 codes are special short-codes,
           and the minimum offset is 1. */
        size_t distance_code = ComputeDistanceCode(
            sr.distance, dictionary_start + gap, dist_cache);
        if ((sr.distance <= (dictionary_start + gap)) && distance_code > 0) {
          dist_cache[3] = dist_cache[2];
          dist_cache[2] = dist_cache[1];
          dist_cache[1] = dist_cache[0];
          dist_cache[0] = (int)sr.distance;
          FN(PrepareDistanceCache)(privat, dist_cache);
        }
        InitCommand(commands++, &params->dist, insert_length,
            sr.len, sr.len_code_delta, distance_code);
      }
      *num_literals += insert_length;
      insert_length = 0;
      /* Put the hash keys into the table, if there are enough bytes left.
         Depending on the hasher implementation, it can push all positions
         in the given range or only a subset of them.
         Avoid hash poisoning with RLE data. */
      {
        size_t range_start = position + 2;
        size_t range_end = BROTLI_MIN(size_t, position + sr.len, store_end);
        if (sr.distance < (sr.len >> 2)) {
          range_start = BROTLI_MIN(size_t, range_end, BROTLI_MAX(size_t,
              range_start, position + sr.len - (sr.distance << 2)));
        }
        FN(StoreRange)(privat, ringbuffer, ringbuffer_mask, range_start,
                       range_end);
      }
      position += sr.len;
    } else {
      ++insert_length;
      ++position;
      /* If we have not seen matches for a long time, we can skip some
         match lookups. Unsuccessful match lookups are very very expensive
         and this kind of a heuristic speeds up compression quite
         a lot. */
      if (position > apply_random_heuristics) {
        /* Going through uncompressible data, jump. */
        if (position >
            apply_random_heuristics + 4 * random_heuristics_window_size) {
          /* It is quite a long time since we saw a copy, so we assume
             that this data is not compressible, and store hashes less
             often. Hashes of non compressible data are less likely to
             turn out to be useful in the future, too, so we store less of
             them to not to flood out the hash table of good compressible
             data. */
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 4);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 16, pos_end - kMargin);
          for (; position < pos_jump; position += 4) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 4;
          }
        } else {
          const size_t kMargin =
              BROTLI_MAX(size_t, FN(StoreLookahead)() - 1, 2);
          size_t pos_jump =
              BROTLI_MIN(size_t, position + 8, pos_end - kMargin);
          for (; position < pos_jump; position += 2) {
            FN(Store)(privat, ringbuffer, ringbuffer_mask, position);
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += pos_end - position;
  *last_insert_len = insert_length;
  *num_commands += (size_t)(commands - orig_commands);
}